

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

void * density::detail::
       LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
       ::get_element(LfQueueControl *i_control,bool i_is_external)

{
  undefined8 *i_address;
  runtime_type<> *this;
  size_t i_alignment;
  undefined8 local_20;
  void *result;
  bool i_is_external_local;
  LfQueueControl *i_control_local;
  
  i_address = (undefined8 *)address_add(i_control,0x10);
  if (i_is_external) {
    local_20 = (void *)*i_address;
  }
  else {
    this = type_after_control((ControlBlock *)i_control);
    i_alignment = runtime_type<>::alignment(this);
    local_20 = address_upper_align(i_address,i_alignment);
  }
  return local_20;
}

Assistant:

static void * get_element(detail::LfQueueControl * i_control, bool i_is_external)
            {
                auto result = address_add(i_control, s_element_min_offset);
                if (i_is_external)
                {
                    /* i_control and s_element_min_offset are aligned to
                       alignof(ExternalBlock), so we don't need to align further */
                    result = static_cast<ExternalBlock *>(result)->m_block;
                }
                else
                {
                    result =
                      address_upper_align(result, type_after_control(i_control)->alignment());
                }
                return result;
            }